

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_LoadNodes<mapnode_t,mapsubsector_t>(MapData *map)

{
  ushort uVar1;
  ushort uVar2;
  FileReader *pFVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [12];
  undefined8 *buffer;
  node_t *pnVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  FMemLump *__s;
  undefined8 *puVar16;
  anon_union_32_2_9298864e_for_node_t_4 *paVar17;
  undefined8 *puVar18;
  ulong uVar19;
  anon_union_32_2_9298864e_for_node_t_4 *paVar20;
  size_t __n;
  ulong uVar21;
  undefined8 *puVar22;
  undefined1 auVar23 [16];
  long lStack_40;
  FMemLump local_38;
  FMemLump data;
  
  __s = &local_38;
  lStack_40 = 0x4d4ab6;
  FMemLump::FMemLump(&local_38);
  pFVar3 = map->MapLumps[7].Reader;
  uVar12 = 0;
  if (pFVar3 == (FileReader *)0x0) {
    uVar15 = 0;
  }
  else {
    uVar15 = (ulong)(int)pFVar3->Length;
  }
  pFVar3 = map->MapLumps[6].Reader;
  if (pFVar3 != (FileReader *)0x0) {
    uVar12 = (uint)pFVar3->Length;
  }
  lStack_40 = 0x1c;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar15;
  numnodes = SUB164(auVar4 / ZEXT816(0x1c),0);
  if ((uVar12 < 4) || (numnodes == 0 && uVar12 >> 2 != 1)) {
    ForceNodeBuild = true;
  }
  else {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)numnodes;
    uVar19 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0x48),8) == 0) {
      uVar19 = SUB168(auVar5 * ZEXT816(0x48),0);
    }
    lStack_40 = 0x4d4b24;
    nodes = (node_t *)operator_new__(uVar19);
    __n = (SUB168(auVar4 / ZEXT816(0x1c),0) << 0x20) >> 0x1f;
    lVar9 = -(__n + 0xf & 0xfffffffffffffff0);
    __s = (FMemLump *)((long)&local_38 + lVar9);
    *(undefined8 *)((long)&lStack_40 + lVar9) = 0x4d4b52;
    memset(__s,0,__n);
    *(undefined8 *)((long)&lStack_40 + lVar9) = 0x4d4b5a;
    buffer = (undefined8 *)operator_new__(uVar15);
    *(undefined8 *)((long)&lStack_40 + lVar9) = 7;
    uVar6 = *(undefined8 *)((long)&lStack_40 + lVar9);
    *(undefined8 *)((long)&lStack_40 + lVar9) = 0xffffffffffffffff;
    uVar7 = *(undefined8 *)((long)&lStack_40 + lVar9);
    *(undefined8 *)((long)&lStack_40 + lVar9) = 0x4d4b6e;
    MapData::Read(map,(uint)uVar6,buffer,(int)uVar7);
    puVar16 = buffer + 1;
    paVar17 = &nodes->field_4;
    pnVar11 = nodes;
    puVar18 = buffer;
    for (uVar15 = 0; (int)uVar15 < numnodes; uVar15 = (ulong)((int)uVar15 + 1)) {
      uVar6 = *puVar18;
      auVar10._10_2_ = (short)((ulong)uVar6 >> 0x20);
      auVar10._0_10_ = (unkuint10)0;
      auVar23._2_12_ =
           SUB1612(ZEXT616(CONCAT42(auVar10._8_4_,(short)((ulong)uVar6 >> 0x10))) << 0x30,4);
      auVar23._0_2_ = (short)uVar6;
      auVar23._14_2_ = 0;
      auVar23 = auVar23 << 0x10;
      pnVar11->x = auVar23._0_4_;
      pnVar11->y = auVar23._4_4_;
      pnVar11->dx = auVar23._8_4_;
      pnVar11->dy = auVar23._12_4_;
      paVar20 = paVar17;
      puVar22 = puVar16;
      for (uVar19 = 0; uVar19 != 2; uVar19 = uVar19 + 1) {
        uVar1 = *(ushort *)((long)puVar18 + uVar19 * 2 + 0x18);
        uVar14 = (uint)uVar1;
        if (-1 < (short)uVar1) {
          if ((int)uVar14 < numnodes) {
            uVar21 = (ulong)uVar14;
            uVar2 = *(ushort *)((long)__s + uVar21 * 2);
            if (uVar2 == 0) {
              *(node_t **)((long)&pnVar11->field_6 + uVar19 * 8) = nodes + uVar21;
              *(short *)((long)__s + uVar21 * 2) = (short)uVar19 + 1;
              goto LAB_004d4c1c;
            }
            *(undefined8 *)((long)&lStack_40 + lVar9) = 0x4d4ca2;
            Printf("BSP node %d references node %d,\nwhich is already used by node %d.\nThe BSP will be rebuilt.\n"
                   ,uVar15,(ulong)uVar1,(ulong)(uVar2 - 1));
          }
          else {
            lVar13 = *(long *)((long)&pnVar11->field_6 + (uVar19 & 0xffffffff) * 8);
            *(undefined8 *)((long)&lStack_40 + lVar9) = 0x48;
            lVar8 = *(long *)((long)&lStack_40 + lVar9);
            *(undefined8 *)((long)&lStack_40 + lVar9) = 0x4d4c90;
            Printf("BSP node %d references invalid node %td.\nThe BSP will be rebuilt.\n",uVar15,
                   (lVar13 - (long)nodes) / lVar8);
          }
LAB_004d4cb2:
          ForceNodeBuild = true;
          if (nodes != (node_t *)0x0) {
            *(undefined8 *)((long)&lStack_40 + lVar9) = 0x4d4cca;
            operator_delete__(nodes);
          }
          goto LAB_004d4cca;
        }
        if (uVar12 >> 2 <= (uVar14 & 0x7fff)) {
          *(undefined8 *)((long)&lStack_40 + lVar9) = 0x4d4cb2;
          Printf("BSP node %d references invalid subsector %d.\nThe BSP will be rebuilt.\n");
          goto LAB_004d4cb2;
        }
        *(undefined1 **)((long)&pnVar11->field_6 + uVar19 * 8) =
             (undefined1 *)((long)&subsectors[uVar14 & 0x7fff].sector + 1);
LAB_004d4c1c:
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          *(float *)((long)paVar20 + lVar13 * 4) =
               (float)(int)*(short *)((long)puVar22 + lVar13 * 2);
        }
        puVar22 = puVar22 + 1;
        paVar20 = (anon_union_32_2_9298864e_for_node_t_4 *)((long)paVar20 + 0x10);
      }
      pnVar11 = pnVar11 + 1;
      puVar18 = (undefined8 *)((long)puVar18 + 0x1c);
      puVar16 = (undefined8 *)((long)puVar16 + 0x1c);
      paVar17 = (anon_union_32_2_9298864e_for_node_t_4 *)((long)paVar17 + 0x48);
    }
LAB_004d4cca:
    *(undefined8 *)((long)&lStack_40 + lVar9) = 0x4d4cd2;
    operator_delete__(buffer);
  }
  *(undefined8 *)((long)__s + -8) = 0x4d4cdb;
  FMemLump::~FMemLump(&local_38);
  return;
}

Assistant:

void P_LoadNodes (MapData * map)
{
	FMemLump	data;
	int 		i;
	int 		j;
	int 		k;
	char		*mnp;
	nodetype	*mn;
	node_t* 	no;
	WORD*		used;
	int			lumplen = map->Size(ML_NODES);
	int			maxss = map->Size(ML_SSECTORS) / sizeof(subsectortype);

	numnodes = (lumplen - nodetype::NF_LUMPOFFSET) / sizeof(nodetype);

	if ((numnodes == 0 && maxss != 1) || maxss == 0)
	{
		ForceNodeBuild = true;
		return;
	}
	
	nodes = new node_t[numnodes];		
	used = (WORD *)alloca (sizeof(WORD)*numnodes);
	memset (used, 0, sizeof(WORD)*numnodes);

	mnp = new char[lumplen];
	mn = (nodetype*)(mnp + nodetype::NF_LUMPOFFSET);
	map->Read(ML_NODES, mnp);
	no = nodes;
	
	for (i = 0; i < numnodes; i++, no++, mn++)
	{
		no->x = LittleShort(mn->x)<<FRACBITS;
		no->y = LittleShort(mn->y)<<FRACBITS;
		no->dx = LittleShort(mn->dx)<<FRACBITS;
		no->dy = LittleShort(mn->dy)<<FRACBITS;
		for (j = 0; j < 2; j++)
		{
			int child = mn->Child(j);
			if (child & nodetype::NF_SUBSECTOR)
			{
				child &= ~nodetype::NF_SUBSECTOR;
				if (child >= maxss)
				{
					Printf ("BSP node %d references invalid subsector %d.\n"
						"The BSP will be rebuilt.\n", i, child);
					ForceNodeBuild = true;
					delete[] nodes;
					delete[] mnp;
					return;
				}
				no->children[j] = (BYTE *)&subsectors[child] + 1;
			}
			else if (child >= numnodes)
			{
				Printf ("BSP node %d references invalid node %td.\n"
					"The BSP will be rebuilt.\n", i, (node_t *)no->children[j] - nodes);
				ForceNodeBuild = true;
				delete[] nodes;
				delete[] mnp;
				return;
			}
			else if (used[child])
			{
				Printf ("BSP node %d references node %d,\n"
					"which is already used by node %d.\n"
					"The BSP will be rebuilt.\n", i, child, used[child]-1);
				ForceNodeBuild = true;
				delete[] nodes;
				delete[] mnp;
				return;
			}
			else
			{
				no->children[j] = &nodes[child];
				used[child] = j + 1;
			}
			for (k = 0; k < 4; k++)
			{
				no->bbox[j][k] = (float)LittleShort(mn->bbox[j][k]);
			}
		}
	}
	delete[] mnp;
}